

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O3

bool __thiscall
pstack::Dwarf::Unit::sourceFromAddr
          (Unit *this,Addr addr,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *info)

{
  int iVar1;
  LineInfo *pLVar2;
  FileEntry *pFVar3;
  long lVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ContainsAddr CVar7;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  pointer pLVar13;
  undefined1 local_90 [8];
  DIE d;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  root((DIE *)local_90,this);
  CVar7 = DIE::containsAddress((DIE *)local_90,addr);
  if (CVar7 != NO) {
    puVar8 = getLines(this);
    pLVar2 = (puVar8->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
             .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl;
    if (pLVar2 != (LineInfo *)0x0) {
      for (pLVar13 = *(pointer *)
                      &(pLVar2->matrix).
                       super__Vector_base<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
                       ._M_impl;
          pLVar13 !=
          *(pointer *)
           ((long)&(pLVar2->matrix).
                   super__Vector_base<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
           + 8); pLVar13 = pLVar13 + 1) {
        if ((((pLVar13->field_0x18 & 4) == 0) && (pLVar13->addr <= addr)) &&
           (addr < pLVar13[1].addr)) {
          pFVar3 = pLVar13->file;
          iVar1 = ((this->dwarf->elf).
                   super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  context->verbose;
          if (iVar1 == 0) {
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_48,*(long *)&pFVar3->name,
                       *(size_type *)((long)&pFVar3->name + 8) + *(long *)&pFVar3->name);
          }
          else {
            lVar4 = *(long *)&(pLVar2->directories).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl;
            lVar10 = (ulong)pFVar3->dirindex * 0x20;
            d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = &local_58;
            lVar5 = *(long *)(lVar4 + lVar10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,lVar5,*(long *)(lVar4 + 8 + lVar10) + lVar5);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,"/");
            pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&d.unit.
                                     super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,*(char **)&pLVar13->file->name,
                                 *(size_type *)((long)&pLVar13->file->name + 8));
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar9->_M_dataplus)._M_p;
            paVar11 = &pbVar9->field_2;
            if (paVar6 == paVar11) {
              local_48.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_48.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            }
            else {
              local_48.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_48._M_dataplus._M_p = (pointer)paVar6;
            }
            local_48._M_string_length = pbVar9->_M_string_length;
            (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar9->_M_string_length = 0;
            (pbVar9->field_2)._M_local_buf[0] = '\0';
          }
          std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::__cxx11::string,unsigned_int&>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)info,&local_48,&pLVar13->line);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          if ((iVar1 != 0) &&
             (d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != &local_58)) {
            operator_delete(d.unit.
                            super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(long)local_58._vptr__Sp_counted_base + 1);
          }
          bVar12 = true;
          goto LAB_00143950;
        }
      }
    }
  }
  bVar12 = false;
LAB_00143950:
  DIE::~DIE((DIE *)local_90);
  return bVar12;
}

Assistant:

bool
Unit::sourceFromAddr(Elf::Addr addr, std::vector<std::pair<std::string, int>> &info) {
    DIE d = root();
    if (d.containsAddress(addr) == ContainsAddr::NO)
        return false;
    const auto &lines = getLines();
    if (lines != nullptr) {
        for (auto i = lines->matrix.begin(); i != lines->matrix.end(); ++i) {
            if (i->end_sequence)
                continue;
            auto next = i+1;
            if (i->addr <= addr && next->addr > addr) {
                const std::string &dirname = lines->directories[i->file->dirindex];
                info.emplace_back(dwarf->elf->context.verbose != 0 ? dirname + "/" + i->file->name : i->file->name, i->line);
                return true;
            }
        }
    }
    return false;
}